

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_conncontrol(connectdata *conn,int ctrl)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = ctrl;
  if (ctrl != 1) {
    if (ctrl == 2) {
      uVar2 = (uint)((conn->handler->flags & 0x200) == 0);
    }
    else {
      uVar2 = 0;
    }
  }
  if (((ctrl != 2) || ((conn->handler->flags & 0x200) == 0)) &&
     (uVar1 = *(uint *)&(conn->bits).field_0x4, uVar2 != (uVar1 & 1))) {
    *(uint *)&(conn->bits).field_0x4 = uVar1 & 0xfffffffe | uVar2 & 1;
  }
  return;
}

Assistant:

const char *reason
#endif
  )
{
  /* close if a connection, or a stream that isn't multiplexed */
  bool closeit = (ctrl == CONNCTRL_CONNECTION) ||
    ((ctrl == CONNCTRL_STREAM) && !(conn->handler->flags & PROTOPT_STREAM));
  if((ctrl == CONNCTRL_STREAM) &&
     (conn->handler->flags & PROTOPT_STREAM))
    DEBUGF(infof(conn->data, "Kill stream: %s\n", reason));
  else if((bit)closeit != conn->bits.close) {
    DEBUGF(infof(conn->data, "Marked for [%s]: %s\n",
                 closeit?"closure":"keep alive", reason));
    conn->bits.close = closeit; /* the only place in the source code that
                                   should assign this bit */
  }
}